

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetime-c.cpp
# Opt level: O2

duckdb_time_tz_struct duckdb_from_time_tz(duckdb_time_tz input)

{
  duckdb_time_tz_struct dVar1;
  
  dVar1.time = duckdb_from_time((duckdb_time)(input.bits >> 0x18));
  dVar1.offset = 0xe0ff - ((uint)input.bits & 0xffffff);
  return dVar1;
}

Assistant:

duckdb_time_tz_struct duckdb_from_time_tz(duckdb_time_tz input) {
	duckdb_time_tz_struct result;
	duckdb_time time;

	duckdb::dtime_tz_t time_tz(input.bits);

	time.micros = time_tz.time().micros;

	result.time = duckdb_from_time(time);
	result.offset = time_tz.offset();
	return result;
}